

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_setting_nds_with_Tenors_Test::TestBody
          (SubjectFactoryTest_test_setting_nds_with_Tenors_Test *this)

{
  bool bVar1;
  string *psVar2;
  Tenor *pTVar3;
  undefined8 *puVar4;
  char *pcVar5;
  AssertHelper local_160;
  Message local_158;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [48];
  FX local_c8 [64];
  undefined8 local_88;
  string local_80 [32];
  Subject local_60 [24];
  string local_48 [32];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  SubjectFactory subject_factory;
  SubjectFactoryTest_test_setting_nds_with_Tenors_Test *this_local;
  
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory
            ((SubjectFactory *)&gtest_ar.message_,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_88 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Nds();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"CSFX",&local_f9);
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider(local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"USDCNY",&local_121);
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148,"USD",&local_149);
  bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar2);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                              (1000000.0);
  bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar3);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                              (850000.0);
  puVar4 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar3);
  (**(code **)*puVar4)(local_60);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_28,
             "\"AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett\""
             ,
             "subject_factory.Fx().Stream().Nds() .LiquidityProvider(\"CSFX\") .CurrencyPair(\"USDCNY\") .Currency(\"USD\") .NearQuantity(1000000) .NearTenor(Tenor::IN_1_MONTH) .FarQuantity(850000) .FarTenor(Tenor::IN_3_MONTHS) .CreateSubject() .ToString().c_str()"
             ,
             "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett"
             ,pcVar5);
  std::__cxx11::string::~string(local_48);
  Subject::~Subject(local_60);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  SubjectFactory::FX::~FX(local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
               ,0x254,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_nds_with_Tenors)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett",
            subject_factory.Fx().Stream().Nds()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("USDCNY")
                    .Currency("USD")
                    .NearQuantity(1000000)
                    .NearTenor(Tenor::IN_1_MONTH)
                    .FarQuantity(850000)
                    .FarTenor(Tenor::IN_3_MONTHS)
                    .CreateSubject()
                    .ToString().c_str());
}